

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreevent.h
# Opt level: O3

void __thiscall QAlphaWidget::closeEvent(QAlphaWidget *this,QCloseEvent *e)

{
  e[0xc] = (QCloseEvent)0x1;
  if ((__uniq_ptr_impl<QAlphaWidget,_DeleteLater>)
      q_blend._M_t.super___uniq_ptr_impl<QAlphaWidget,_DeleteLater>._M_t.
      super__Tuple_impl<0UL,_QAlphaWidget_*,_DeleteLater>.
      super__Head_base<0UL,_QAlphaWidget_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<QAlphaWidget,_DeleteLater>)0x0) {
    this->showWidget = false;
    render(this);
    QWidget::closeEvent(&this->super_QWidget,e);
    return;
  }
  return;
}

Assistant:

inline void accept() { m_accept = true; }